

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O3

SplittingStepCoefficients SplittingStepCoefficients_Copy(SplittingStepCoefficients coefficients)

{
  SplittingStepCoefficients pSVar1;
  
  if ((coefficients != (SplittingStepCoefficients)0x0) &&
     (pSVar1 = SplittingStepCoefficients_Alloc
                         (coefficients->sequential_methods,coefficients->stages,
                          coefficients->partitions), pSVar1 != (SplittingStepCoefficients)0x0)) {
    pSVar1->order = coefficients->order;
    memcpy(pSVar1->alpha,coefficients->alpha,(long)coefficients->sequential_methods << 3);
    memcpy(**pSVar1->beta,**coefficients->beta,
           (long)coefficients->partitions * (long)coefficients->sequential_methods *
           ((long)coefficients->stages + 1) * 8);
    return pSVar1;
  }
  return (SplittingStepCoefficients)0x0;
}

Assistant:

SplittingStepCoefficients SplittingStepCoefficients_Copy(
  const SplittingStepCoefficients coefficients)
{
  if (coefficients == NULL) { return NULL; }

  SplittingStepCoefficients coefficientsCopy =
    SplittingStepCoefficients_Alloc(coefficients->sequential_methods,
                                    coefficients->stages,
                                    coefficients->partitions);
  if (coefficientsCopy == NULL) { return NULL; }

  coefficientsCopy->order = coefficients->order;
  memcpy(coefficientsCopy->alpha, coefficients->alpha,
         coefficients->sequential_methods * sizeof(sunrealtype));

  /* beta[0][0] points to the contiguous memory allocation, so we can copy it
     with a single memcpy */
  memcpy(coefficientsCopy->beta[0][0], coefficients->beta[0][0],
         coefficients->sequential_methods * (coefficients->stages + 1) *
           coefficients->partitions * sizeof(sunrealtype));

  return coefficientsCopy;
}